

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvdir.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  __time_t _Var2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  char *x4;
  long lVar6;
  int *piVar7;
  iopause_fd *x;
  char **ppcVar8;
  char ch;
  int wstat;
  taia now;
  taia stampcheck;
  taia deadline;
  stat s;
  char local_11d;
  int local_11c;
  long local_118;
  int local_10c;
  taia local_108;
  taia local_f0;
  taia local_d8;
  stat local_c0;
  
  ppcVar8 = argv + 1;
  progname = *argv;
  if (argv[1] == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-P] dir","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  if (**ppcVar8 != '-') goto LAB_001029f0;
  cVar1 = (*ppcVar8)[1];
  if (cVar1 == '-') {
LAB_001029b3:
    ppcVar8 = argv + 2;
  }
  else if (cVar1 == 'P') {
    pgrp = 1;
    goto LAB_001029b3;
  }
  if (*ppcVar8 == (char *)0x0) {
    strerr_die(1,"usage: ",progname," [-P] dir","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
LAB_001029f0:
  sig_catch(sig_term,s_term);
  sig_catch(sig_hangup,s_hangup);
  svdir = *ppcVar8;
  if ((ppcVar8[1] != (char *)0x0) && (rplog = ppcVar8[1], iVar3 = setup_log(), iVar3 != 1)) {
    rplog = (char *)0x0;
    strerr_warn("runsvdir ",svdir,": warning: ","log service disabled.",(char *)0x0,(char *)0x0,
                (strerr *)0x0);
  }
  local_11c = open_read(".");
  if (local_11c == -1) {
    strerr_die(100,"runsvdir ",svdir,": fatal: ","unable to open current directory",(char *)0x0,": "
               ,&strerr_sys);
  }
  coe(local_11c);
  taia_now(&local_f0);
  local_118 = 0;
LAB_00102b05:
  do {
    iVar3 = wait_nohang(&local_10c);
    if (0 < iVar3) {
      if (0 < (long)svnum) {
        lVar6 = 0;
        do {
          if (iVar3 == *(int *)((long)&sv[0].pid + lVar6)) {
            *(undefined4 *)((long)&sv[0].pid + lVar6) = 0;
            check = 1;
            break;
          }
          lVar6 = lVar6 + 0x18;
        } while ((long)svnum * 0x18 != lVar6);
      }
      goto LAB_00102b05;
    }
    taia_now(&local_108);
    if (local_108.sec.x < local_f0.sec.x - 3) {
      strerr_warn("runsvdir ",svdir,": warning: ","time warp: resetting time stamp.",(char *)0x0,
                  (char *)0x0,(strerr *)0x0);
      taia_now(&local_f0);
      taia_now(&local_108);
      if (rplog != (char *)0x0) {
        taia_now(&stamplog);
      }
    }
    iVar3 = taia_less(&local_108,&local_f0);
    if (iVar3 == 0) {
      taia_uint(&local_d8,1);
      taia_add(&local_f0,&local_108,&local_d8);
      iVar3 = stat(svdir,&local_c0);
      _Var2 = local_c0.st_mtim.tv_sec;
      x4 = "unable to stat ";
      if (iVar3 == -1) {
LAB_00102cd1:
        strerr_warn("runsvdir ",svdir,": warning: ",x4,svdir,": ",&strerr_sys);
      }
      else if (((local_c0.st_mtim.tv_sec != local_118 || check != 0) || (local_c0.st_ino != ino)) ||
              (local_c0.st_dev != dev)) {
        iVar3 = chdir(svdir);
        x4 = "unable to change directory to ";
        if (iVar3 == -1) goto LAB_00102cd1;
        dev = local_c0.st_dev;
        ino = local_c0.st_ino;
        check = 0;
        if (local_108.sec.x <= _Var2 + 0x400000000000000aU) {
          sleep(1);
        }
        runsvdir();
        iVar4 = fchdir(local_11c);
        iVar3 = local_11c;
        if (iVar4 == -1) {
          local_118 = _Var2;
          do {
            strerr_warn("runsvdir ",svdir,": warning: ","unable to change directory, pausing",
                        (char *)0x0,": ",&strerr_sys);
            sleep(5);
            iVar4 = fchdir(iVar3);
          } while (iVar4 == -1);
        }
        else {
          local_118 = _Var2;
        }
      }
    }
    if ((rplog != (char *)0x0) && (iVar3 = taia_less(&local_108,&stamplog), iVar3 == 0)) {
      write(logpipe[1],".",1);
      taia_uint(&local_d8,900);
      taia_add(&stamplog,&local_108,&local_d8);
    }
    taia_uint(&local_d8,(uint)(check == 0) * 4 + 1);
    taia_add(&local_d8,&local_108,&local_d8);
    sig_block(sig_child);
    if (rplog == (char *)0x0) {
      x = (iopause_fd *)0x0;
    }
    else {
      x = io;
    }
    iopause(x,(uint)(rplog != (char *)0x0),&local_d8,&local_108);
    sig_unblock(sig_child);
    if (rplog != (char *)0x0) {
      while (sVar5 = read(logpipe[0],&local_11d,1), 0 < sVar5) {
        if (local_11d != '\0') {
          if (6 < rploglen) {
            lVar6 = 6;
            do {
              rplog[lVar6 + -1] = rplog[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 < rploglen);
          }
          rplog[(long)rploglen + -1] = local_11d;
        }
      }
    }
    if (exitsoon == 1) {
      _exit(0);
    }
    if (exitsoon == 2) {
      if (0 < svnum) {
        piVar7 = &sv[0].pid;
        lVar6 = 0;
        do {
          if (*piVar7 != 0) {
            kill(*piVar7,0xf);
          }
          lVar6 = lVar6 + 1;
          piVar7 = piVar7 + 6;
        } while (lVar6 < svnum);
      }
      _exit(0x6f);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  time_t mtime =0;
  int wstat;
  int curdir;
  int pid;
  struct taia deadline;
  struct taia now;
  struct taia stampcheck;
  char ch;
  int i;

  progname =*argv++;
  if (! argv || ! *argv) usage();
  if (**argv == '-') {
    switch (*(*argv +1)) {
    case 'P': pgrp =1;
    case '-': ++argv;
    }
    if (! argv || ! *argv) usage();
  }

  sig_catch(sig_term, s_term);
  sig_catch(sig_hangup, s_hangup);
  svdir =*argv++;
  if (argv && *argv) {
    rplog =*argv;
    if (setup_log() != 1) {
      rplog =0;
      warn3x("log service disabled.", 0, 0);
    }
  }
  if ((curdir =open_read(".")) == -1)
    fatal("unable to open current directory", 0);
  coe(curdir);

  taia_now(&stampcheck);

  for (;;) {
    /* collect children */
    for (;;) {
      if ((pid =wait_nohang(&wstat)) <= 0) break;
      for (i =0; i < svnum; i++) {
        if (pid == sv[i].pid) {
          /* runsv has gone */
          sv[i].pid =0;
          check =1;
          break;
        }
      }
    }

    taia_now(&now);
    if (now.sec.x < (stampcheck.sec.x -3)) {
      /* time warp */
      warn3x("time warp: resetting time stamp.", 0, 0);
      taia_now(&stampcheck);
      taia_now(&now);
      if (rplog) taia_now(&stamplog);
    }
    if (taia_less(&now, &stampcheck) == 0) {
      /* wait at least a second */
      taia_uint(&deadline, 1);
      taia_add(&stampcheck, &now, &deadline);

      if (stat(svdir, &s) != -1) {
        if (check || \
            s.st_mtime != mtime || s.st_ino != ino || s.st_dev != dev) {
          /* svdir modified */
          if (chdir(svdir) != -1) {
            mtime =s.st_mtime;
            dev =s.st_dev;
            ino =s.st_ino;
            check =0;
            if (now.sec.x <= (4611686018427387914ULL +(uint64)mtime))
              sleep(1);
            runsvdir();
            while (fchdir(curdir) == -1) {
              warn("unable to change directory, pausing", 0);
              sleep(5);
            }
          }
          else
            warn("unable to change directory to ", svdir);
        }
      }
      else
        warn("unable to stat ", svdir);
    }

    if (rplog)
      if (taia_less(&now, &stamplog) == 0) {
        write(logpipe[1], ".", 1);
        taia_uint(&deadline, 900);
        taia_add(&stamplog, &now, &deadline);
      }
    taia_uint(&deadline, check ? 1 : 5);
    taia_add(&deadline, &now, &deadline);

    sig_block(sig_child);
    if (rplog)
      iopause(io, 1, &deadline, &now);
    else
      iopause(0, 0, &deadline, &now);
    sig_unblock(sig_child);

    if (rplog && (io[0].revents | IOPAUSE_READ))
      while (read(logpipe[0], &ch, 1) > 0)
        if (ch) {
          for (i =6; i < rploglen; i++)
            rplog[i -1] =rplog[i];
          rplog[rploglen -1] =ch;
        }

    switch(exitsoon) {
    case 1:
      _exit(0);
    case 2:
      for (i =0; i < svnum; i++) if (sv[i].pid) kill(sv[i].pid, SIGTERM);
      _exit(111);
    }
  }
  /* not reached */
  _exit(0);
}